

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool openjtalk_setVoiceDir(OpenJTalk *oj,char *path)

{
  _Bool _Var1;
  size_t sVar2;
  char *pcVar3;
  char *in_RSI;
  long in_RDI;
  char *res;
  char temp [260];
  char *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  char *in_stack_ffffffffffffffd0;
  OpenJTalk *in_stack_ffffffffffffffd8;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    *(undefined4 *)(in_RDI + 0x678) = 0;
    if ((in_RSI != (char *)0x0) && (sVar2 = strlen(in_RSI), sVar2 != 0)) {
      pcVar3 = u8tou8_path(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      if (pcVar3 == (char *)0x0) {
        return false;
      }
      _Var1 = set_voice_dir_and_voice(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      return _Var1;
    }
    *(undefined4 *)(in_RDI + 0x678) = 0xb;
  }
  return false;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_setVoiceDir(OpenJTalk *oj, const char *path)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return false;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (!path || strlen(path) == 0)
	{
		oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
		return false;
	}
	char temp[MAX_PATH];
#if defined(_WIN32)
	char *res = u8tou8_path(path, temp);
#else
	char *res = u8tou8_path(path, temp);
#endif
	if (!res)
	{
		return false;
	}
	return set_voice_dir_and_voice(oj, temp);
}